

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O3

gboolean postEventSourceDispatch(GSource *s,GSourceFunc param_2,gpointer param_3)

{
  *(undefined4 *)((long)&s[1].callback_data + 4) = *(undefined4 *)&s[1].callback_data;
  QCoreApplication::sendPostedEvents((QObject *)0x0,0);
  *(undefined1 *)(*(long *)(s[1].callback_funcs + 0xb0) + 0x8c) = 0;
  return 1;
}

Assistant:

static gboolean postEventSourceDispatch(GSource *s, GSourceFunc, gpointer)
{
    GPostEventSource *source = reinterpret_cast<GPostEventSource *>(s);
    source->lastSerialNumber = source->serialNumber.loadRelaxed();
    QCoreApplication::sendPostedEvents();
    source->d->runTimersOnceWithNormalPriority();
    return true; // i dunno, george...
}